

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O1

char * crn_get_mip_mode_desc(crn_mip_mode m)

{
  if (m < cCRNMipModeTotal) {
    return &DAT_001a8f64 + *(int *)(&DAT_001a8f64 + (ulong)m * 4);
  }
  return "?";
}

Assistant:

const char* crn_get_mip_mode_desc(crn_mip_mode m)
{
    switch (m)
    {
    case cCRNMipModeUseSourceOrGenerateMips:
        return "Use source/generate if none";
    case cCRNMipModeUseSourceMips:
        return "Only use source MIP maps (if any)";
    case cCRNMipModeGenerateMips:
        return "Always generate new MIP maps";
    case cCRNMipModeNoMips:
        return "No MIP maps";
    default:
        break;
    }
    return "?";
}